

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O0

size_t ZSTD_HcFindBestMatch_dictMatchState_selectMLS
                 (ZSTD_matchState_t *ms,BYTE *ip,BYTE *iLimit,size_t *offsetPtr)

{
  uint uVar1;
  U32 *pUVar2;
  BYTE *pBVar3;
  ZSTD_matchState_t *pZVar4;
  U32 *pUVar5;
  U32 *pUVar6;
  BYTE *pBVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  U32 UVar13;
  U32 UVar14;
  size_t sVar15;
  BYTE *pBVar16;
  BYTE *pBVar17;
  uint local_910;
  uint local_8c8;
  U32 local_8c4;
  U32 local_8c0;
  uint local_8a8;
  uint local_860;
  U32 local_85c;
  U32 local_858;
  uint local_840;
  uint local_7f8;
  U32 local_7f4;
  U32 local_7f0;
  size_t *offsetPtr_local;
  BYTE *iLimit_local;
  BYTE *ip_local;
  ZSTD_matchState_t *ms_local;
  BYTE *match_14;
  size_t currentMl_11;
  U32 dmsMinChain_2;
  U32 dmsIndexDelta_2;
  U32 dmsSize_2;
  BYTE *dmsEnd_2;
  BYTE *dmsBase_2;
  U32 dmsLowestIndex_2;
  U32 dmsChainMask_2;
  U32 dmsChainSize_2;
  U32 *dmsChainTable_2;
  BYTE *match_11;
  BYTE *match_10;
  size_t currentMl_8;
  U32 *entry_2;
  U32 matchIndex_4;
  size_t ddsIdx_2;
  U32 ddsHashLog_2;
  ZSTD_matchState_t *dms_2;
  size_t ml_2;
  U32 nbAttempts_2;
  U32 minChain_2;
  U32 lowLimit_2;
  U32 isDictionary_2;
  U32 withinMaxDistance_2;
  U32 lowestValid_2;
  U32 maxDistance_2;
  U32 curr_2;
  BYTE *dictEnd_2;
  BYTE *prefixStart_2;
  U32 dictLimit_2;
  BYTE *dictBase_2;
  BYTE *base_4;
  U32 chainMask_4;
  U32 chainSize_2;
  U32 *chainTable_4;
  ZSTD_compressionParameters *cParams_2;
  size_t h_2;
  U32 idx_2;
  U32 target_2;
  BYTE *base_5;
  U32 chainMask_5;
  U32 *chainTable_5;
  U32 hashLog_2;
  U32 *hashTable_2;
  size_t local_610;
  size_t local_5f8;
  BYTE *match_9;
  size_t currentMl_7;
  U32 dmsMinChain_1;
  U32 dmsIndexDelta_1;
  U32 dmsSize_1;
  BYTE *dmsEnd_1;
  BYTE *dmsBase_1;
  U32 dmsLowestIndex_1;
  U32 dmsChainMask_1;
  U32 dmsChainSize_1;
  U32 *dmsChainTable_1;
  BYTE *match_6;
  BYTE *match_5;
  size_t currentMl_4;
  U32 *entry_1;
  U32 matchIndex_2;
  size_t ddsIdx_1;
  U32 ddsHashLog_1;
  ZSTD_matchState_t *dms_1;
  size_t ml_1;
  U32 nbAttempts_1;
  U32 minChain_1;
  U32 lowLimit_1;
  U32 isDictionary_1;
  U32 withinMaxDistance_1;
  U32 lowestValid_1;
  U32 maxDistance_1;
  U32 curr_1;
  BYTE *dictEnd_1;
  BYTE *prefixStart_1;
  U32 dictLimit_1;
  BYTE *dictBase_1;
  BYTE *base_2;
  U32 chainMask_2;
  U32 chainSize_1;
  U32 *chainTable_2;
  ZSTD_compressionParameters *cParams_1;
  size_t h_1;
  U32 idx_1;
  U32 target_1;
  BYTE *base_3;
  U32 chainMask_3;
  U32 *chainTable_3;
  U32 hashLog_1;
  U32 *hashTable_1;
  size_t local_440;
  size_t local_428;
  BYTE *match_4;
  size_t currentMl_3;
  U32 dmsMinChain;
  U32 dmsIndexDelta;
  U32 dmsSize;
  BYTE *dmsEnd;
  BYTE *dmsBase;
  U32 dmsLowestIndex;
  U32 dmsChainMask;
  U32 dmsChainSize;
  U32 *dmsChainTable;
  BYTE *match_1;
  BYTE *match;
  size_t currentMl;
  U32 *entry;
  U32 matchIndex;
  size_t ddsIdx;
  U32 ddsHashLog;
  ZSTD_matchState_t *dms;
  size_t ml;
  U32 nbAttempts;
  U32 minChain;
  U32 lowLimit;
  U32 isDictionary;
  U32 withinMaxDistance;
  U32 lowestValid;
  U32 maxDistance;
  U32 curr;
  BYTE *dictEnd;
  BYTE *prefixStart;
  U32 dictLimit;
  BYTE *dictBase;
  BYTE *base;
  U32 chainMask;
  U32 chainSize;
  U32 *chainTable;
  ZSTD_compressionParameters *cParams;
  size_t h;
  U32 idx;
  U32 target;
  BYTE *base_1;
  U32 chainMask_1;
  U32 *chainTable_1;
  U32 hashLog;
  U32 *hashTable;
  size_t local_270;
  size_t local_258;
  BYTE *match_3;
  size_t currentMl_2;
  U32 chainAttempt;
  U32 chainLimit;
  U32 chainAttempts;
  U32 chainLength;
  U32 chainIndex_1;
  U32 chainPackedPointer_1;
  BYTE *match_2;
  size_t currentMl_1;
  U32 chainIndex;
  U32 chainPackedPointer;
  U32 matchIndex_1;
  U32 ddsAttempt;
  U32 bucketLimit;
  U32 bucketSize;
  U32 ddsIndexDelta;
  U32 ddsSize;
  BYTE *ddsEnd;
  BYTE *ddsBase;
  U32 ddsLowestIndex;
  BYTE *match_8;
  size_t currentMl_6;
  U32 chainAttempt_1;
  U32 chainLimit_1;
  U32 chainAttempts_1;
  U32 chainLength_1;
  U32 chainIndex_3;
  U32 chainPackedPointer_3;
  BYTE *match_7;
  size_t currentMl_5;
  U32 chainIndex_2;
  U32 chainPackedPointer_2;
  U32 matchIndex_3;
  U32 ddsAttempt_1;
  U32 bucketLimit_1;
  U32 bucketSize_1;
  U32 ddsIndexDelta_1;
  U32 ddsSize_1;
  BYTE *ddsEnd_1;
  BYTE *ddsBase_1;
  U32 ddsLowestIndex_1;
  BYTE *match_13;
  size_t currentMl_10;
  U32 chainAttempt_2;
  U32 chainLimit_2;
  U32 chainAttempts_2;
  U32 chainLength_2;
  U32 chainIndex_5;
  U32 chainPackedPointer_5;
  BYTE *match_12;
  size_t currentMl_9;
  U32 chainIndex_4;
  U32 chainPackedPointer_4;
  U32 matchIndex_5;
  U32 ddsAttempt_2;
  U32 bucketLimit_2;
  U32 bucketSize_2;
  U32 ddsIndexDelta_2;
  U32 ddsSize_2;
  BYTE *ddsEnd_2;
  BYTE *ddsBase_2;
  U32 ddsLowestIndex_2;
  
  uVar1 = (ms->cParams).minMatch;
  iVar8 = (int)ip;
  if (uVar1 != 4) {
    if (uVar1 == 5) {
      pUVar2 = ms->chainTable;
      uVar9 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
      pBVar3 = (ms->window).base;
      uVar1 = (ms->window).dictLimit;
      uVar10 = iVar8 - (int)pBVar3;
      uVar11 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      local_85c = (ms->window).lowLimit;
      local_858 = local_85c;
      if (uVar11 < uVar10 - local_85c) {
        local_858 = uVar10 - uVar11;
      }
      if (ms->loadedDictEnd == 0) {
        local_85c = local_858;
      }
      if (uVar9 < uVar10) {
        local_860 = uVar10 - uVar9;
      }
      else {
        local_860 = 0;
      }
      ml_1._0_4_ = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
      dms_1 = (ZSTD_matchState_t *)0x3;
      pZVar4 = ms->dictMatchState;
      pUVar5 = ms->hashTable;
      UVar13 = (ms->cParams).hashLog;
      pUVar6 = ms->chainTable;
      uVar11 = (ms->cParams).chainLog;
      pBVar7 = (ms->window).base;
      uVar12 = iVar8 - (int)pBVar7;
      for (h_1._0_4_ = ms->nextToUpdate; (U32)h_1 < uVar12; h_1._0_4_ = (U32)h_1 + 1) {
        pBVar17 = pBVar7 + (U32)h_1;
        switch(0xc1e09e) {
        case 0:
          local_428 = ZSTD_hash4Ptr(pBVar17,UVar13);
          break;
        case 1:
          local_428 = ZSTD_hash5Ptr(pBVar17,UVar13);
          break;
        case 2:
          local_428 = ZSTD_hash6Ptr(pBVar17,UVar13);
          break;
        case 3:
          local_428 = ZSTD_hash7Ptr(pBVar17,UVar13);
          break;
        case 4:
          local_428 = ZSTD_hash8Ptr(pBVar17,UVar13);
        }
        pUVar6[(U32)h_1 & (1 << ((byte)uVar11 & 0x1f)) - 1U] = pUVar5[local_428];
        pUVar5[local_428] = (U32)h_1;
      }
      ms->nextToUpdate = uVar12;
      switch(0xc1e1f9) {
      case 0:
        local_440 = ZSTD_hash4Ptr(ip,UVar13);
        break;
      case 1:
        local_440 = ZSTD_hash5Ptr(ip,UVar13);
        break;
      case 2:
        local_440 = ZSTD_hash6Ptr(ip,UVar13);
        break;
      case 3:
        local_440 = ZSTD_hash7Ptr(ip,UVar13);
        break;
      case 4:
        local_440 = ZSTD_hash8Ptr(ip,UVar13);
      }
      for (entry_1._4_4_ = pUVar5[local_440]; local_85c <= entry_1._4_4_ && (int)ml_1 != 0;
          entry_1._4_4_ = pUVar2[entry_1._4_4_ & uVar9 - 1]) {
        match_5 = (BYTE *)0x0;
        if ((pBVar3 + entry_1._4_4_)[(long)dms_1] == ip[(long)dms_1]) {
          match_5 = (BYTE *)ZSTD_count(ip,pBVar3 + entry_1._4_4_,iLimit);
        }
        if (dms_1 < match_5) {
          dms_1 = (ZSTD_matchState_t *)match_5;
          *offsetPtr = (ulong)((uVar10 - entry_1._4_4_) + 2);
          if (ip + (long)match_5 == iLimit) break;
        }
        if (entry_1._4_4_ <= local_860) break;
        ml_1._0_4_ = (int)ml_1 + -1;
      }
      pUVar2 = pZVar4->chainTable;
      uVar11 = 1 << ((byte)(pZVar4->cParams).chainLog & 0x1f);
      uVar9 = (pZVar4->window).dictLimit;
      pBVar7 = (pZVar4->window).base;
      pBVar17 = (pZVar4->window).nextSrc;
      uVar12 = (int)pBVar17 - (int)pBVar7;
      if (uVar11 < uVar12) {
        local_8a8 = uVar12 - uVar11;
      }
      else {
        local_8a8 = 0;
      }
      pUVar5 = pZVar4->hashTable;
      sVar15 = ZSTD_hash5Ptr(ip,(pZVar4->cParams).hashLog);
      entry_1._4_4_ = pUVar5[sVar15];
      while( true ) {
        if (entry_1._4_4_ < uVar9 || (int)ml_1 == 0) {
          return (size_t)dms_1;
        }
        match_9 = (BYTE *)0x0;
        pBVar16 = pBVar7 + entry_1._4_4_;
        UVar13 = MEM_read32(pBVar16);
        UVar14 = MEM_read32(ip);
        if (UVar13 == UVar14) {
          sVar15 = ZSTD_count_2segments(ip + 4,pBVar16 + 4,iLimit,pBVar17,pBVar3 + uVar1);
          match_9 = (BYTE *)(sVar15 + 4);
        }
        if (dms_1 < match_9) {
          dms_1 = (ZSTD_matchState_t *)match_9;
          *offsetPtr = (ulong)((uVar10 - (entry_1._4_4_ + (uVar1 - uVar12))) + 2);
          if (ip + (long)match_9 == iLimit) {
            return (size_t)match_9;
          }
        }
        if (entry_1._4_4_ <= local_8a8) break;
        entry_1._4_4_ = pUVar2[entry_1._4_4_ & uVar11 - 1];
        ml_1._0_4_ = (int)ml_1 + -1;
      }
      return (size_t)dms_1;
    }
    if (uVar1 - 6 < 2) {
      pUVar2 = ms->chainTable;
      uVar9 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
      pBVar3 = (ms->window).base;
      uVar1 = (ms->window).dictLimit;
      uVar10 = iVar8 - (int)pBVar3;
      uVar11 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      local_8c4 = (ms->window).lowLimit;
      local_8c0 = local_8c4;
      if (uVar11 < uVar10 - local_8c4) {
        local_8c0 = uVar10 - uVar11;
      }
      if (ms->loadedDictEnd == 0) {
        local_8c4 = local_8c0;
      }
      if (uVar9 < uVar10) {
        local_8c8 = uVar10 - uVar9;
      }
      else {
        local_8c8 = 0;
      }
      ml_2._0_4_ = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
      dms_2 = (ZSTD_matchState_t *)0x3;
      pZVar4 = ms->dictMatchState;
      pUVar5 = ms->hashTable;
      UVar13 = (ms->cParams).hashLog;
      pUVar6 = ms->chainTable;
      uVar11 = (ms->cParams).chainLog;
      pBVar7 = (ms->window).base;
      uVar12 = iVar8 - (int)pBVar7;
      for (h_2._0_4_ = ms->nextToUpdate; (U32)h_2 < uVar12; h_2._0_4_ = (U32)h_2 + 1) {
        pBVar17 = pBVar7 + (U32)h_2;
        switch(0xc1f208) {
        case 0:
          local_5f8 = ZSTD_hash4Ptr(pBVar17,UVar13);
          break;
        case 1:
          local_5f8 = ZSTD_hash5Ptr(pBVar17,UVar13);
          break;
        case 2:
          local_5f8 = ZSTD_hash6Ptr(pBVar17,UVar13);
          break;
        case 3:
          local_5f8 = ZSTD_hash7Ptr(pBVar17,UVar13);
          break;
        case 4:
          local_5f8 = ZSTD_hash8Ptr(pBVar17,UVar13);
        }
        pUVar6[(U32)h_2 & (1 << ((byte)uVar11 & 0x1f)) - 1U] = pUVar5[local_5f8];
        pUVar5[local_5f8] = (U32)h_2;
      }
      ms->nextToUpdate = uVar12;
      switch(0xc1f363) {
      case 0:
        local_610 = ZSTD_hash4Ptr(ip,UVar13);
        break;
      case 1:
        local_610 = ZSTD_hash5Ptr(ip,UVar13);
        break;
      case 2:
        local_610 = ZSTD_hash6Ptr(ip,UVar13);
        break;
      case 3:
        local_610 = ZSTD_hash7Ptr(ip,UVar13);
        break;
      case 4:
        local_610 = ZSTD_hash8Ptr(ip,UVar13);
      }
      for (entry_2._4_4_ = pUVar5[local_610]; local_8c4 <= entry_2._4_4_ && (int)ml_2 != 0;
          entry_2._4_4_ = pUVar2[entry_2._4_4_ & uVar9 - 1]) {
        match_10 = (BYTE *)0x0;
        if ((pBVar3 + entry_2._4_4_)[(long)dms_2] == ip[(long)dms_2]) {
          match_10 = (BYTE *)ZSTD_count(ip,pBVar3 + entry_2._4_4_,iLimit);
        }
        if (dms_2 < match_10) {
          dms_2 = (ZSTD_matchState_t *)match_10;
          *offsetPtr = (ulong)((uVar10 - entry_2._4_4_) + 2);
          if (ip + (long)match_10 == iLimit) break;
        }
        if (entry_2._4_4_ <= local_8c8) break;
        ml_2._0_4_ = (int)ml_2 + -1;
      }
      pUVar2 = pZVar4->chainTable;
      uVar11 = 1 << ((byte)(pZVar4->cParams).chainLog & 0x1f);
      uVar9 = (pZVar4->window).dictLimit;
      pBVar7 = (pZVar4->window).base;
      pBVar17 = (pZVar4->window).nextSrc;
      uVar12 = (int)pBVar17 - (int)pBVar7;
      if (uVar11 < uVar12) {
        local_910 = uVar12 - uVar11;
      }
      else {
        local_910 = 0;
      }
      pUVar5 = pZVar4->hashTable;
      sVar15 = ZSTD_hash6Ptr(ip,(pZVar4->cParams).hashLog);
      entry_2._4_4_ = pUVar5[sVar15];
      while( true ) {
        if (entry_2._4_4_ < uVar9 || (int)ml_2 == 0) {
          return (size_t)dms_2;
        }
        match_14 = (BYTE *)0x0;
        pBVar16 = pBVar7 + entry_2._4_4_;
        UVar13 = MEM_read32(pBVar16);
        UVar14 = MEM_read32(ip);
        if (UVar13 == UVar14) {
          sVar15 = ZSTD_count_2segments(ip + 4,pBVar16 + 4,iLimit,pBVar17,pBVar3 + uVar1);
          match_14 = (BYTE *)(sVar15 + 4);
        }
        if (dms_2 < match_14) {
          dms_2 = (ZSTD_matchState_t *)match_14;
          *offsetPtr = (ulong)((uVar10 - (entry_2._4_4_ + (uVar1 - uVar12))) + 2);
          if (ip + (long)match_14 == iLimit) {
            return (size_t)match_14;
          }
        }
        if (entry_2._4_4_ <= local_910) break;
        entry_2._4_4_ = pUVar2[entry_2._4_4_ & uVar11 - 1];
        ml_2._0_4_ = (int)ml_2 + -1;
      }
      return (size_t)dms_2;
    }
  }
  pUVar2 = ms->chainTable;
  uVar9 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
  pBVar3 = (ms->window).base;
  uVar1 = (ms->window).dictLimit;
  uVar10 = iVar8 - (int)pBVar3;
  uVar11 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  local_7f4 = (ms->window).lowLimit;
  local_7f0 = local_7f4;
  if (uVar11 < uVar10 - local_7f4) {
    local_7f0 = uVar10 - uVar11;
  }
  if (ms->loadedDictEnd == 0) {
    local_7f4 = local_7f0;
  }
  if (uVar9 < uVar10) {
    local_7f8 = uVar10 - uVar9;
  }
  else {
    local_7f8 = 0;
  }
  ml._0_4_ = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
  dms = (ZSTD_matchState_t *)0x3;
  pZVar4 = ms->dictMatchState;
  pUVar5 = ms->hashTable;
  UVar13 = (ms->cParams).hashLog;
  pUVar6 = ms->chainTable;
  uVar11 = (ms->cParams).chainLog;
  pBVar7 = (ms->window).base;
  uVar12 = iVar8 - (int)pBVar7;
  for (h._0_4_ = ms->nextToUpdate; (U32)h < uVar12; h._0_4_ = (U32)h + 1) {
    pBVar17 = pBVar7 + (U32)h;
    switch(0xc1cf34) {
    case 0:
      local_258 = ZSTD_hash4Ptr(pBVar17,UVar13);
      break;
    case 1:
      local_258 = ZSTD_hash5Ptr(pBVar17,UVar13);
      break;
    case 2:
      local_258 = ZSTD_hash6Ptr(pBVar17,UVar13);
      break;
    case 3:
      local_258 = ZSTD_hash7Ptr(pBVar17,UVar13);
      break;
    case 4:
      local_258 = ZSTD_hash8Ptr(pBVar17,UVar13);
    }
    pUVar6[(U32)h & (1 << ((byte)uVar11 & 0x1f)) - 1U] = pUVar5[local_258];
    pUVar5[local_258] = (U32)h;
  }
  ms->nextToUpdate = uVar12;
  switch(0xc1d08f) {
  case 0:
    local_270 = ZSTD_hash4Ptr(ip,UVar13);
    break;
  case 1:
    local_270 = ZSTD_hash5Ptr(ip,UVar13);
    break;
  case 2:
    local_270 = ZSTD_hash6Ptr(ip,UVar13);
    break;
  case 3:
    local_270 = ZSTD_hash7Ptr(ip,UVar13);
    break;
  case 4:
    local_270 = ZSTD_hash8Ptr(ip,UVar13);
  }
  for (entry._4_4_ = pUVar5[local_270]; local_7f4 <= entry._4_4_ && (int)ml != 0;
      entry._4_4_ = pUVar2[entry._4_4_ & uVar9 - 1]) {
    match = (BYTE *)0x0;
    if ((pBVar3 + entry._4_4_)[(long)dms] == ip[(long)dms]) {
      match = (BYTE *)ZSTD_count(ip,pBVar3 + entry._4_4_,iLimit);
    }
    if (dms < match) {
      dms = (ZSTD_matchState_t *)match;
      *offsetPtr = (ulong)((uVar10 - entry._4_4_) + 2);
      if (ip + (long)match == iLimit) break;
    }
    if (entry._4_4_ <= local_7f8) break;
    ml._0_4_ = (int)ml + -1;
  }
  pUVar2 = pZVar4->chainTable;
  uVar11 = 1 << ((byte)(pZVar4->cParams).chainLog & 0x1f);
  uVar9 = (pZVar4->window).dictLimit;
  pBVar7 = (pZVar4->window).base;
  pBVar17 = (pZVar4->window).nextSrc;
  uVar12 = (int)pBVar17 - (int)pBVar7;
  if (uVar11 < uVar12) {
    local_840 = uVar12 - uVar11;
  }
  else {
    local_840 = 0;
  }
  pUVar5 = pZVar4->hashTable;
  sVar15 = ZSTD_hash4Ptr(ip,(pZVar4->cParams).hashLog);
  entry._4_4_ = pUVar5[sVar15];
  while( true ) {
    if (entry._4_4_ < uVar9 || (int)ml == 0) {
      return (size_t)dms;
    }
    match_4 = (BYTE *)0x0;
    pBVar16 = pBVar7 + entry._4_4_;
    UVar13 = MEM_read32(pBVar16);
    UVar14 = MEM_read32(ip);
    if (UVar13 == UVar14) {
      sVar15 = ZSTD_count_2segments(ip + 4,pBVar16 + 4,iLimit,pBVar17,pBVar3 + uVar1);
      match_4 = (BYTE *)(sVar15 + 4);
    }
    if (dms < match_4) {
      dms = (ZSTD_matchState_t *)match_4;
      *offsetPtr = (ulong)((uVar10 - (entry._4_4_ + (uVar1 - uVar12))) + 2);
      if (ip + (long)match_4 == iLimit) {
        return (size_t)match_4;
      }
    }
    if (entry._4_4_ <= local_840) break;
    entry._4_4_ = pUVar2[entry._4_4_ & uVar11 - 1];
    ml._0_4_ = (int)ml + -1;
  }
  return (size_t)dms;
}

Assistant:

static size_t ZSTD_HcFindBestMatch_dictMatchState_selectMLS (
                        ZSTD_matchState_t* ms,
                        const BYTE* ip, const BYTE* const iLimit,
                        size_t* offsetPtr)
{
    switch(ms->cParams.minMatch)
    {
    default : /* includes case 3 */
    case 4 : return ZSTD_HcFindBestMatch_generic(ms, ip, iLimit, offsetPtr, 4, ZSTD_dictMatchState);
    case 5 : return ZSTD_HcFindBestMatch_generic(ms, ip, iLimit, offsetPtr, 5, ZSTD_dictMatchState);
    case 7 :
    case 6 : return ZSTD_HcFindBestMatch_generic(ms, ip, iLimit, offsetPtr, 6, ZSTD_dictMatchState);
    }
}